

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

string * __thiscall
cs_impl::any::holder<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_>::to_string
          (string *__return_storage_ptr__,
          holder<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_> *this)

{
  long *plVar1;
  long *plVar2;
  _List_node_base *p_Var3;
  string str;
  long *local_98;
  long local_88;
  long lStack_80;
  _Alloc_hider local_78;
  size_type local_70;
  size_type local_68;
  undefined2 uStack_60;
  undefined6 uStack_5e;
  string *local_58;
  string local_50;
  
  p_Var3 = (this->mDat).super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  local_58 = __return_storage_ptr__;
  if (p_Var3 == (_List_node_base *)&this->mDat) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = 0x203e3d207473696c;
    *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 8) = 0x7d7b;
    __return_storage_ptr__->_M_string_length = 10;
    (__return_storage_ptr__->field_2)._M_local_buf[10] = '\0';
  }
  else {
    local_78._M_p = (pointer)&local_68;
    local_68 = 0x203e3d207473696c;
    uStack_60 = 0x7b;
    local_70 = 9;
    do {
      any::to_string_abi_cxx11_(&local_50,(any *)(p_Var3 + 1));
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
      plVar2 = plVar1 + 2;
      if ((long *)*plVar1 == plVar2) {
        local_88 = *plVar2;
        lStack_80 = plVar1[3];
        local_98 = &local_88;
      }
      else {
        local_88 = *plVar2;
        local_98 = (long *)*plVar1;
      }
      *plVar1 = (long)plVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_98);
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      p_Var3 = p_Var3->_M_next;
    } while (p_Var3 != (_List_node_base *)&this->mDat);
    std::__cxx11::string::resize((ulong)&local_78,(char)local_70 + -2);
    std::__cxx11::string::append((char *)&local_78);
    (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
    if ((size_type *)local_78._M_p == &local_68) {
      (local_58->field_2)._M_allocated_capacity = local_68;
      *(ulong *)((long)&local_58->field_2 + 8) = CONCAT62(uStack_5e,uStack_60);
    }
    else {
      (local_58->_M_dataplus)._M_p = local_78._M_p;
      (local_58->field_2)._M_allocated_capacity = local_68;
    }
    local_58->_M_string_length = local_70;
  }
  return local_58;
}

Assistant:

std::string to_string() const override
			{
				return cs_impl::to_string(mDat);
			}